

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O2

void __thiscall JSONNode::merge(JSONNode *this,JSONNode *other)

{
  if (this->internal != other->internal) {
    operator=(other,this);
    return;
  }
  return;
}

Assistant:

void JSONNode::merge(JSONNode * other) json_nothrow {
	   JSON_CHECK_INTERNAL();
	   if (internal == other -> internal) return;
	   *other = *this;
    }